

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermSymbol * __thiscall
glslang::HlslParseContext::findTessLinkageSymbol(HlslParseContext *this,TBuiltInVariable biType)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  TBuiltInVariable biType_local;
  HlslParseContext *this_local;
  
  it._M_node._4_4_ = biType;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
       ::find(&(this->builtInTessLinkageSymbols).
               super_map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
              ,(key_type *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
       ::end(&(this->builtInTessLinkageSymbols).
              super_map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
            );
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (HlslParseContext *)0x0;
  }
  else {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>
             ::operator->(&local_28);
    iVar2 = (*ppVar3->second->_vptr_TSymbol[9])();
    this_local = (HlslParseContext *)
                 TIntermediate::addSymbol(this_00,(TVariable *)CONCAT44(extraout_var,iVar2));
  }
  return (TIntermSymbol *)this_local;
}

Assistant:

TIntermSymbol* HlslParseContext::findTessLinkageSymbol(TBuiltInVariable biType) const
{
    const auto it = builtInTessLinkageSymbols.find(biType);
    if (it == builtInTessLinkageSymbols.end())  // if it wasn't declared by the user, return nullptr
        return nullptr;

    return intermediate.addSymbol(*it->second->getAsVariable());
}